

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

size_t Extract(string *where_from,string *where_to,size_t pos,char delim)

{
  size_t sVar1;
  undefined7 in_register_00000009;
  string asStack_48 [32];
  
  sVar1 = std::__cxx11::string::find
                    ((char)where_from,CONCAT71(in_register_00000009,delim) & 0xffffffff);
  if (sVar1 == 0xffffffffffffffff) {
    std::__cxx11::string::_M_assign((string *)where_to);
  }
  else {
    std::__cxx11::string::substr((ulong)asStack_48,(ulong)where_from);
    std::__cxx11::string::operator=((string *)where_to,asStack_48);
    std::__cxx11::string::~string(asStack_48);
  }
  return sVar1;
}

Assistant:

size_t Extract(const std::string& where_from, std::string& where_to, size_t pos, const char delim)
{
    size_t end = where_from.find_first_of(delim, pos);
    
    if (end != std::string::npos)
        where_to = where_from.substr(pos, end - pos);
    else
        where_to = where_from;
    
    return end;
}